

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

int build_json(ps_config_t *config,char *json,int len)

{
  long *plVar1;
  bool bVar2;
  hash_iter_t *itor;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  char *__s;
  int iVar10;
  int iVar11;
  uint local_4c;
  
  local_4c = snprintf(json,(ulong)(uint)len,"{\n");
  iVar10 = -1;
  if (-1 < (int)local_4c) {
    __s = json + local_4c;
    if (json == (char *)0x0) {
      __s = (char *)0x0;
    }
    uVar7 = 0;
    if (json != (char *)0x0) {
      uVar7 = local_4c;
    }
    iVar10 = len - uVar7;
    for (itor = hash_table_iter(config->ht); itor != (hash_iter_t *)0x0;
        itor = hash_table_iter_next(itor)) {
      pcVar5 = itor->ent->key;
      plVar1 = (long *)itor->ent->val;
      if (((*(byte *)(plVar1 + 1) & 8) == 0) || (*plVar1 != 0)) {
        if (__s == (char *)0x0) {
          pcVar6 = (char *)0x0;
          iVar11 = iVar10;
        }
        else {
          __s[0] = '\t';
          __s[1] = '\"';
          pcVar6 = __s + 2;
          iVar11 = iVar10 + -2;
        }
        if (pcVar6 == (char *)0x0) {
          sVar3 = strlen(pcVar5);
          sVar4 = measure_string((uint)sVar3,pcVar5);
          iVar8 = (int)sVar4;
          pcVar6 = (char *)0x0;
        }
        else {
          if (iVar11 < 1) {
            __assert_fail("maxlen > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                          ,400,"int serialize_key(char *, int, const char *)");
          }
          sVar3 = strlen(pcVar5);
          sVar4 = serialize_string(pcVar6,(uint)sVar3,pcVar5);
          iVar8 = (int)sVar4;
          pcVar6 = pcVar6 + iVar8;
          iVar11 = iVar11 - iVar8;
        }
        if (pcVar6 != (char *)0x0) {
          if (iVar11 < 1) {
            __assert_fail("maxlen > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                          ,0x19b,"int serialize_key(char *, int, const char *)");
          }
          pcVar6[0] = '\"';
          pcVar6[1] = ':';
          pcVar6[2] = ' ';
        }
        bVar2 = true;
        if (-6 < iVar8) {
          uVar9 = iVar8 + 5;
          local_4c = local_4c + uVar9;
          uVar7 = uVar9;
          pcVar6 = __s + uVar9;
          if (__s == (char *)0x0) {
            uVar7 = 0;
            pcVar6 = __s;
          }
          __s = pcVar6;
          iVar10 = iVar10 - uVar7;
          uVar7 = *(uint *)(plVar1 + 1);
          if ((uVar7 & 8) == 0) {
            if ((uVar7 & 2) == 0) {
              if ((uVar7 & 0x10) != 0) {
                pcVar5 = "true";
                if (*plVar1 == 0) {
                  pcVar5 = "false";
                }
                pcVar6 = "%s,\n";
                goto LAB_001104b4;
              }
              if ((uVar7 & 4) == 0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                        ,0x1f5,"Unknown type %d for parameter %s\n",(ulong)uVar7,pcVar5);
                goto LAB_001104c1;
              }
              uVar9 = snprintf(__s,(long)iVar10,"%g,\n",*plVar1);
            }
            else {
              pcVar5 = (char *)*plVar1;
              pcVar6 = "%ld,\n";
LAB_001104b4:
              uVar9 = snprintf(__s,(long)iVar10,pcVar6,pcVar5);
            }
            if ((int)uVar9 < 0) goto LAB_001104de;
          }
          else {
            pcVar5 = (char *)*plVar1;
            if (__s == (char *)0x0) {
              pcVar6 = (char *)0x0;
              iVar11 = iVar10;
            }
            else {
              pcVar6 = __s + 1;
              *__s = '\"';
              iVar11 = iVar10 + -1;
            }
            if (pcVar6 == (char *)0x0) {
              sVar3 = strlen(pcVar5);
              sVar4 = measure_string((uint)sVar3,pcVar5);
              iVar8 = (int)sVar4;
              pcVar6 = (char *)0x0;
            }
            else {
              if (iVar11 < 1) {
                __assert_fail("maxlen > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                              ,0x1af,"int serialize_value(char *, int, const char *)");
              }
              sVar3 = strlen(pcVar5);
              sVar4 = serialize_string(pcVar6,(uint)sVar3,pcVar5);
              iVar8 = (int)sVar4;
              pcVar6 = pcVar6 + iVar8;
              iVar11 = iVar11 - iVar8;
            }
            if (pcVar6 != (char *)0x0) {
              if (iVar11 < 1) {
                __assert_fail("maxlen > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                              ,0x1ba,"int serialize_value(char *, int, const char *)");
              }
              pcVar6[0] = '\"';
              pcVar6[1] = ',';
              pcVar6[2] = '\n';
            }
            if (iVar8 < -4) goto LAB_001104de;
            uVar9 = iVar8 + 4;
          }
LAB_001104c1:
          local_4c = local_4c + uVar9;
          bVar2 = false;
          pcVar5 = __s + uVar9;
          if (__s == (char *)0x0) {
            uVar9 = 0;
            pcVar5 = __s;
          }
          __s = pcVar5;
          iVar10 = iVar10 - uVar9;
        }
      }
      else {
        bVar2 = false;
      }
LAB_001104de:
      if (bVar2) {
        return -1;
      }
    }
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
    }
    else if (json + 1 < __s) {
      iVar10 = iVar10 + 2;
      __s = __s + -2;
    }
    iVar11 = snprintf(__s,(long)iVar10,"\n}\n");
    iVar10 = -1;
    if (-1 < iVar11) {
      iVar10 = local_4c + iVar11;
    }
  }
  return iVar10;
}

Assistant:

static int
build_json(ps_config_t *config, char *json, int len)
{
    hash_iter_t *itor;
    char *ptr = json;
    int l, rv = 0;

    if ((l = snprintf(ptr, len, "{\n")) < 0)
        return -1;
    rv += l;
    if (ptr) {
        len -= l;
        ptr += l;
    }
    for (itor = hash_table_iter(config->ht); itor;
         itor = hash_table_iter_next(itor)) {
        const char *key = hash_entry_key(itor->ent);
        cmd_ln_val_t *cval = hash_entry_val(itor->ent);
        if (cval->type & ARG_STRING && cval->val.ptr == NULL)
            continue;
        if ((l = serialize_key(ptr, len, key)) < 0)
            return -1;
        rv += l;
        if (ptr) {
            len -= l;
            ptr += l;
        }
        if (cval->type & ARG_STRING) {
            if ((l = serialize_value(ptr, len,
                                     (char *)cval->val.ptr)) < 0)
                return -1;
        }
        else if (cval->type & ARG_INTEGER) {
            if ((l = snprintf(ptr, len, "%ld,\n",
                              cval->val.i)) < 0)
                return -1;
        }
        else if (cval->type & ARG_BOOLEAN) {
            if ((l = snprintf(ptr, len, "%s,\n",
                              cval->val.i ? "true" : "false")) < 0)
                return -1;
        }
        else if (cval->type & ARG_FLOATING) {
            if ((l = snprintf(ptr, len, "%g,\n",
                              cval->val.fl)) < 0)
                return -1;
        }
        else {
            E_ERROR("Unknown type %d for parameter %s\n",
                    cval->type, key);
        }
        rv += l;
        if (ptr) {
            len -= l;
            ptr += l;
        }
    }
    /* Back off last comma because JSON is awful */
    if (ptr && ptr > json + 1) {
        len += 2;
        ptr -= 2;
    }
    if ((l = snprintf(ptr, len, "\n}\n")) < 0)
        return -1;
    rv += l;
    if (ptr) {
        len -= l;
        ptr += l;
    }
    return rv;
}